

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O0

char * __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::get_data(section_impl<ELFIO::Elf32_Shdr> *this)

{
  bool bVar1;
  pointer pcVar2;
  bool res;
  section_impl<ELFIO::Elf32_Shdr> *this_local;
  
  if ((((this->is_loaded & 1U) == 0) && ((this->can_be_loaded & 1U) != 0)) &&
     (bVar1 = load_data(this), !bVar1)) {
    this->can_be_loaded = false;
  }
  pcVar2 = std::unique_ptr<char[],_std::default_delete<char[]>_>::get(&this->data);
  return pcVar2;
}

Assistant:

const char* get_data() const override
    {
        // If data load failed, the stream is corrupt
        // When lazy loading, attempts to call get_data() on it after initial load are useless
        // When loading non-lazily, that load_data() will attempt to read data from 
        // the stream specified on load() call, which might be freed by this point
        if ( !is_loaded && can_be_loaded ) {
            bool res = load_data();

            if ( !res ) {
                can_be_loaded = false;
            }
        }
        return data.get();
    }